

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZVTKGeoMesh.cpp
# Opt level: O2

int TPZVTKGeoMesh::GetVTK_ElType(TPZGeoEl *gel)

{
  uint uVar1;
  ostream *poVar2;
  
  uVar1 = (**(code **)(*(long *)gel + 0xb8))();
  if (uVar1 < 8) {
    return *(int *)(&DAT_0134d180 + (ulong)uVar1 * 4);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Element type not found on ");
  poVar2 = std::operator<<(poVar2,"static int TPZVTKGeoMesh::GetVTK_ElType(TPZGeoEl *)");
  std::endl<char,std::char_traits<char>>(poVar2);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Post/TPZVTKGeoMesh.cpp"
             ,0x540);
}

Assistant:

int TPZVTKGeoMesh::GetVTK_ElType(TPZGeoEl * gel) {
    MElementType pzElType = gel->Type();

    int elType = -1;
    switch (pzElType) {
        case(EPoint):
        {
            elType = 1;
            break;
        }
        case(EOned):
        {
            elType = 3;
            break;
        }
        case (ETriangle):
        {
            elType = 5;
            break;
        }
        case (EQuadrilateral):
        {
            elType = 9;
            break;
        }
        case (ETetraedro):
        {
            elType = 10;
            break;
        }
        case (EPiramide):
        {
            elType = 14;
            break;
        }
        case (EPrisma):
        {
            elType = 13;
            break;
        }
        case (ECube):
        {
            elType = 12;
            break;
        }
        default:
        {
            std::cout << "Element type not found on " << __PRETTY_FUNCTION__ << std::endl;
            DebugStop();
            break;
        }
    }
    if (elType == -1) {
        std::cout << "Element type not found on " << __PRETTY_FUNCTION__ << std::endl;
        std::cout << "MIGHT BE CURVED ELEMENT (quadratic or quarter point)" << std::endl;
        DebugStop();
    }

    return elType;
}